

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<std::__cxx11::string>
          (TypedConfigurations *this,Level level,
          map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *confMap,char *confName)

{
  iterator iVar1;
  mapped_type *pmVar2;
  key_type local_14;
  key_type local_12;
  
  iVar1 = std::
          _Rb_tree<el::Level,_std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&confMap->_M_t,&local_12);
  if ((_Rb_tree_header *)iVar1._M_node == &(confMap->_M_t)._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(confMap,&local_14);
  }
  else {
    pmVar2 = (mapped_type *)&iVar1._M_node[1]._M_parent;
  }
  return pmVar2;
}

Assistant:

inline Conf_T& unsafeGetConfigByRef(Level level, std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }